

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

void __thiscall MT32Emu::Display::programChanged(Display *this,Bit8u partIndex)

{
  bool bVar1;
  Part *part_00;
  char *pcVar2;
  Part *part;
  Bit8u partIndex_local;
  Display *this_local;
  
  bVar1 = Synth::isDisplayOldMT32Compatible(this->synth);
  if ((bVar1) || ((this->mode != Mode_CUSTOM_MESSAGE && (this->mode != Mode_ERROR_MESSAGE)))) {
    this->mode = Mode_PROGRAM_CHANGE;
    this->lcdDirty = true;
    scheduleDisplayReset(this);
    this->lastProgramChangePartIndex = partIndex;
    part_00 = Synth::getPart(this->synth,partIndex);
    pcVar2 = Synth::getSoundGroupName(this->synth,part_00);
    this->lastProgramChangeSoundGroupName = pcVar2;
    pcVar2 = Part::getCurrentInstr(part_00);
    *(undefined8 *)this->lastProgramChangeTimbreName = *(undefined8 *)pcVar2;
    *(undefined2 *)(this->lastProgramChangeTimbreName + 8) = *(undefined2 *)(pcVar2 + 8);
  }
  return;
}

Assistant:

void Display::programChanged(Bit8u partIndex) {
	if (!synth.isDisplayOldMT32Compatible() && (mode == Mode_CUSTOM_MESSAGE || mode == Mode_ERROR_MESSAGE)) return;
	mode = Mode_PROGRAM_CHANGE;
	lcdDirty = true;
	scheduleDisplayReset();
	lastProgramChangePartIndex = partIndex;
	const Part *part = synth.getPart(partIndex);
	lastProgramChangeSoundGroupName = synth.getSoundGroupName(part);
	memcpy(lastProgramChangeTimbreName, part->getCurrentInstr(), TIMBRE_NAME_SIZE);
}